

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>>
          (Deserializer *this,
          optional<std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>_> *opt
          )

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_> v;
  optional<std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>_> *opt_local;
  Deserializer *this_local;
  
  v.super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)opt;
  std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>::vector
            ((vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_> *)local_30);
  bVar1 = deserialize<dap::ExceptionDetails>
                    (this,(vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_> *)
                          local_30);
  if (bVar1) {
    optional<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>>::operator=
              ((optional<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>> *
               )v.super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_> *)local_30);
  }
  std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>::~vector
            ((vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_> *)local_30);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}